

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_source.cpp
# Opt level: O2

void __thiscall
ImportSource_addRemoveFromImporter_Test::~ImportSource_addRemoveFromImporter_Test
          (ImportSource_addRemoveFromImporter_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ImportSource, addRemoveFromImporter)
{
    auto imp = libcellml::ImportSource::create();
    auto importer = libcellml::Importer::create();

    importer->addImportSource(imp);
    EXPECT_EQ(size_t(1), importer->importSourceCount());
    EXPECT_EQ(imp, importer->importSource(0));

    importer->removeImportSource(imp);
    EXPECT_EQ(size_t(0), importer->importSourceCount());
    EXPECT_EQ(nullptr, importer->importSource(0));

    auto imp1 = libcellml::ImportSource::create();
    auto imp2 = libcellml::ImportSource::create();
    auto c1 = libcellml::Component::create("c1");
    auto c2 = libcellml::Component::create("c2");
    auto u1 = libcellml::Units::create("u1");
    auto u2 = libcellml::Units::create("u2");

    c1->setSourceComponent(imp1, "cc1");
    c2->setSourceComponent(imp1, "cc2");
    u1->setSourceUnits(imp2, "uu1");
    u2->setSourceUnits(imp2, "uu2");

    EXPECT_TRUE(c1->isImport());
    EXPECT_TRUE(c2->isImport());
    EXPECT_TRUE(u1->isImport());
    EXPECT_TRUE(u2->isImport());

    importer->addImportSource(imp1);
    importer->addImportSource(imp2);

    EXPECT_EQ(size_t(2), importer->importSourceCount());

    importer->removeAllImportSources();

    EXPECT_EQ(size_t(0), importer->importSourceCount());

    EXPECT_TRUE(c1->isImport());
    EXPECT_TRUE(c2->isImport());
    EXPECT_TRUE(u1->isImport());
    EXPECT_TRUE(u2->isImport());
}